

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeaderStructs.cpp
# Opt level: O2

void writeTxa<TxaHeaderPS3>(ostream *stream,TxaHeader *header,istream *reference)

{
  pointer pTVar1;
  pointer pTVar2;
  string s;
  TxaChunkPS3 local_78;
  string local_68;
  TxaHeaderPS3 local_48;
  
  std::istream::seekg((long)reference,_S_beg);
  readRaw<TxaHeaderPS3>(&local_48,reference);
  local_48.size.value_ = (uchar  [4])header->filesize;
  local_48.indexed.value_ = (uchar  [4])header->indexed;
  local_48.largestDecodedChunk.value_ = (uchar  [4])header->largestDecodedChunk;
  writeRaw<TxaHeaderPS3>(stream,&local_48);
  pTVar1 = (header->chunks).super__Vector_base<TxaChunk,_std::allocator<TxaChunk>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pTVar2 = (header->chunks).super__Vector_base<TxaChunk,_std::allocator<TxaChunk>_>._M_impl.
                super__Vector_impl_data._M_start; pTVar2 != pTVar1; pTVar2 = pTVar2 + 1) {
    local_78.index.value_ = (uchar  [2])pTVar2->index;
    local_78.width.value_ = (uchar  [2])pTVar2->width;
    local_78.height.value_ = (uchar  [2])pTVar2->height;
    local_78.entryOffset.value_ = (uchar  [4])pTVar2->offset;
    local_78.entryLength.value_ = (uchar  [4])pTVar2->length;
    fromUTF8(&local_68,&pTVar2->name);
    std::__cxx11::string::resize((ulong)&local_68);
    local_78.headerLength.value_ = (uchar  [2])((short)(undefined4)local_68._M_string_length + 0x10)
    ;
    writeRaw<TxaChunkPS3>(stream,&local_78);
    std::ostream::write((char *)stream,(long)local_68._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_68);
  }
  return;
}

Assistant:

void writeTxa(std::ostream& stream, const TxaHeader& header, std::istream& reference) {
	reference.seekg(0, reference.beg);
	Header h = readRaw<Header>(reference);
	h.size = header.filesize;
	h.setIndexSize(header.indexSize);
	h.indexed = header.indexed;
	h.largestDecodedChunk = header.largestDecodedChunk;

	writeRaw(stream, h);
	for (const auto& chunk : header.chunks) {
		typename Header::Chunk c;
		c.index = chunk.index;
		c.width = chunk.width;
		c.height = chunk.height;
		c.entryOffset = chunk.offset;
		c.entryLength = chunk.length;
		c.setDecLength(chunk.decodedLength);
		std::string s = fromUTF8(chunk.name);
		s.resize(align(s.size() + 1, 4));
		c.headerLength = sizeof(c) + s.size();
		writeRaw(stream, c);
		stream.write(s.data(), s.size());
	}
}